

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O0

int __thiscall leveldb::Slice::compare(Slice *this,Slice *b)

{
  long lVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int r;
  size_t min_len;
  size_t local_38;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    local_38 = in_RDI[1];
  }
  else {
    local_38 = in_RSI[1];
  }
  local_24 = memcmp((void *)*in_RDI,(void *)*in_RSI,local_38);
  if (local_24 == 0) {
    if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
      local_24 = -1;
    }
    else if ((ulong)in_RSI[1] < (ulong)in_RDI[1]) {
      local_24 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

inline int Slice::compare(const Slice& b) const {
  const size_t min_len = (size_ < b.size_) ? size_ : b.size_;
  int r = memcmp(data_, b.data_, min_len);
  if (r == 0) {
    if (size_ < b.size_)
      r = -1;
    else if (size_ > b.size_)
      r = +1;
  }
  return r;
}